

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

bool __thiscall QHttp2ProtocolHandler::sendRequest(QHttp2ProtocolHandler *this)

{
  HttpMessagePair *message;
  QHttpNetworkConnectionChannel *this_00;
  byte bVar1;
  QHttpNetworkConnectionChannel *this_01;
  long lVar2;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> QVar3;
  bool bVar4;
  const_iterator cVar5;
  iterator afirst;
  QHttp2Stream *pQVar6;
  const_iterator afirst_00;
  QNonContiguousByteDevice *pQVar7;
  storage_type *psVar8;
  QHttpNetworkRequest *request;
  int iVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QHttp2Stream *stream;
  QUrl promiseKey;
  QString local_88;
  QHttp2Stream *local_68;
  undefined1 *local_60;
  TryEmplaceResult local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QHttpNetworkConnectionChannel **)(this + 0x18);
  bVar1 = *(byte *)(*(long *)(this + 0x38) + 0x2a9);
  if (bVar1 == 1) {
    QHttpNetworkConnectionChannel::emitFinishedWithError
              (this_01,ProtocolUnknownError,"GOAWAY received, cannot start a request");
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
               (*(long *)(this + 0x18) + 0x80));
  }
  else {
    this_00 = this_01 + 0x80;
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detach
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this_00);
    afirst._M_node = *(_Base_ptr *)(*(long *)(this_01 + 0x80) + 0x20);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detach
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this_00);
    lVar2 = *(long *)(this_01 + 0x80);
    while (afirst._M_node != (_Base_ptr)(lVar2 + 0x10)) {
      bVar4 = QHttpNetworkRequest::isPreConnect((QHttpNetworkRequest *)&afirst._M_node[1]._M_parent)
      ;
      if (bVar4) {
        QHttpNetworkConnection::preConnectFinished(*(QHttpNetworkConnection **)(this + 0x30));
        QHttpNetworkReply::finished((QHttpNetworkReply *)afirst._M_node[1]._M_right);
        cVar5.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
        afirst._M_node =
             (_Base_ptr)
             QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                       ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                        this_00,afirst._M_node,cVar5);
        if (((totally_ordered_wrapper<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_*>
              )*(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
                 *)this_00 ==
             (totally_ordered_wrapper<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_*>
              )0x0) ||
           (*(long *)((long)*(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
                              *)this_00 + 0x30) == 0)) goto LAB_001f68f2;
      }
      else {
        afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node);
      }
    }
    if (((totally_ordered_wrapper<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_*>
          )*(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
             *)this_00 !=
         (totally_ordered_wrapper<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_*>
          )0x0) &&
       (*(long *)((long)*(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
                          *)this_00 + 0x30) != 0)) {
      *(undefined4 *)(*(long *)(this + 0x18) + 0x20) = 2;
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detach
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this_00);
      afirst_00._M_node =
           *(_Base_ptr *)
            ((long)*(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
                     *)this_00 + 0x20);
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detach
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this_00);
      QVar3.d.d.ptr =
           *(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
             *)this_00;
      if (afirst_00._M_node == (_Base_ptr)((long)QVar3.d.d.ptr + 0x10)) goto LAB_001f68e7;
      goto LAB_001f66f0;
    }
  }
  goto LAB_001f68f2;
LAB_001f66f0:
  do {
    message = (HttpMessagePair *)((long)afirst_00._M_node + 0x28);
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_72dc2c::urlkey_from_request
              ((anon_unknown_dwarf_72dc2c *)&local_60,(QHttpNetworkRequest *)message);
    pQVar6 = QHttp2Connection::promisedStream(*(QHttp2Connection **)(this + 0x38),(QUrl *)&local_60)
    ;
    if (pQVar6 == (QHttp2Stream *)0x0) {
      local_68 = createNewStream(this,message,false);
      if (local_68 != (QHttp2Stream *)0x0) {
        QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
        tryEmplace_impl<QHttp2Stream*const&>
                  (&local_58,
                   (QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)
                   (this + 0x50),&local_68);
        request = (QHttpNetworkRequest *)
                  ((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries
                   [(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].offsets
                    [(uint)local_58.iterator.i.bucket & 0x7f]].storage.data + 8);
        bVar4 = sendHEADERS(this,local_68,request);
        if (bVar4) {
          pQVar7 = QHttpNetworkRequest::uploadByteDevice(request);
          if ((pQVar7 == (QNonContiguousByteDevice *)0x0) ||
             (bVar4 = sendDATA((QHttp2ProtocolHandler *)request,local_68,
                               *(QHttpNetworkReply **)((long)afirst_00._M_node + 0x38)), bVar4)) {
            cVar5.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst_00._M_node);
            afirst_00._M_node =
                 (_Base_ptr)
                 QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                           ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                            this_00,afirst_00._M_node,cVar5);
            iVar9 = 0;
            goto LAB_001f674c;
          }
          psVar8 = (storage_type *)0x1c;
        }
        else {
          psVar8 = (storage_type *)0x1f;
        }
        pQVar6 = local_68;
        QVar10.m_size = &local_58;
        QVar10.m_data = psVar8;
        QString::fromLatin1(QVar10);
        local_88.d.d = (Data *)local_58.iterator.i.d;
        local_88.d.ptr = (char16_t *)local_58.iterator.i.bucket;
        local_88.d.size = local_58._16_8_;
        finishStreamWithError(this,pQVar6,UnknownNetworkError,&local_88);
        if ((Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
             *)local_88.d.d !=
            (Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
             *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_001f6746;
      }
      bVar4 = QHttpNetworkReply::isFinished(*(QHttpNetworkReply **)((long)afirst_00._M_node + 0x38))
      ;
      iVar9 = 4;
      if (bVar4) {
        cVar5.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst_00._M_node);
        afirst_00._M_node =
             (_Base_ptr)
             QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                       ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                        this_00,afirst_00._M_node,cVar5);
      }
    }
    else {
      initReplyFromPushPromise(this,message,(QUrl *)&local_60);
      cVar5.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst_00._M_node);
      afirst_00._M_node =
           (_Base_ptr)
           QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                     ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                      this_00,afirst_00._M_node,cVar5);
LAB_001f6746:
      iVar9 = 5;
    }
LAB_001f674c:
    QUrl::~QUrl((QUrl *)&local_60);
  } while (((iVar9 == 5) || (iVar9 == 0)) &&
          (afirst_00._M_node != (_Base_ptr)((long)QVar3.d.d.ptr + 0x10)));
LAB_001f68e7:
  *(undefined4 *)(*(long *)(this + 0x18) + 0x20) = 0;
LAB_001f68f2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool QHttp2ProtocolHandler::sendRequest()
{
    if (h2Connection->isGoingAway()) {
        // Stop further calls to this method: we have received GOAWAY
        // so we cannot create new streams.
        m_channel->emitFinishedWithError(QNetworkReply::ProtocolUnknownError,
                                         "GOAWAY received, cannot start a request");
        m_channel->h2RequestsToSend.clear();
        return false;
    }

    // Process 'fake' (created by QNetworkAccessManager::connectToHostEncrypted())
    // requests first:
    auto &requests = m_channel->h2RequestsToSend;
    for (auto it = requests.begin(), endIt = requests.end(); it != endIt;) {
        const auto &pair = *it;
        if (pair.first.isPreConnect()) {
            m_connection->preConnectFinished();
            emit pair.second->finished();
            it = requests.erase(it);
            if (requests.empty()) {
                // Normally, after a connection was established and H2
                // was negotiated, we send a client preface. connectToHostEncrypted
                // though is not meant to send any data, it's just a 'preconnect'.
                // Thus we return early:
                return true;
            }
        } else {
            ++it;
        }
    }

    if (requests.empty())
        return true;

    m_channel->state = QHttpNetworkConnectionChannel::WritingState;
    // Check what was promised/pushed, maybe we do not have to send a request
    // and have a response already?

    for (auto it = requests.begin(), end = requests.end(); it != end;) {
        HttpMessagePair &httpPair = *it;

        QUrl promiseKey = urlkey_from_request(httpPair.first);
        if (h2Connection->promisedStream(promiseKey) != nullptr) {
            // There's a PUSH_PROMISE for this request, so we don't send one
            initReplyFromPushPromise(httpPair, promiseKey);
            it = requests.erase(it);
            continue;
        }

        QHttp2Stream *stream = createNewStream(httpPair);
        if (!stream) { // There was an issue creating the stream
            // Check if it was unrecoverable, ie. the reply is errored out and finished:
            if (httpPair.second->isFinished()) {
                it = requests.erase(it);
            }
            // ... either way we stop looping:
            break;
        }

        QHttpNetworkRequest &request = requestReplyPairs[stream].first;
        if (!sendHEADERS(stream, request)) {
            finishStreamWithError(stream, QNetworkReply::UnknownNetworkError,
                    "failed to send HEADERS frame(s)"_L1);
            continue;
        }
        if (request.uploadByteDevice()) {
            if (!sendDATA(stream, httpPair.second)) {
                finishStreamWithError(stream, QNetworkReply::UnknownNetworkError,
                                      "failed to send DATA frame(s)"_L1);
                continue;
            }
        }
        it = requests.erase(it);
    }

    m_channel->state = QHttpNetworkConnectionChannel::IdleState;

    return true;
}